

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
::rebalance_or_split
          (btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
           *this,iterator *iter)

{
  CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<google::protobuf::Edition>,_google::protobuf::Edition>::checked_compare,_std::allocator<google::protobuf::Edition>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*>
  *alloc;
  field_type fVar1;
  field_type fVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
  *pbVar7;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *this_00;
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
  *pbVar8;
  node_type *dest;
  uint uVar9;
  uint uVar10;
  int iVar11;
  iterator parent_iter;
  
  fVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
          ::count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                   *)iter->node_);
  fVar2 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
          ::max_count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                       *)iter->node_);
  if (fVar1 != fVar2) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                  ,0xa33,
                  "void absl::container_internal::btree<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>]"
                 );
  }
  fVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
          ::max_count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                       *)iter->node_);
  if (fVar1 != '=') {
    __assert_fail("kNodeSlots == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                  ,0xa34,
                  "void absl::container_internal::btree<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>]"
                 );
  }
  pbVar7 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
           ::parent((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                     *)iter->node_);
  if ((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
       *)iter->node_ == this->root_) {
    pbVar7 = new_internal_node(this,'\0',pbVar7);
    fVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            ::start(pbVar7);
    btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
    ::init_child(pbVar7,fVar1,
                 (btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                  *)iter->node_);
    this->root_ = pbVar7;
    pbVar8 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
             ::start_child(pbVar7);
    bVar5 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            ::is_internal(pbVar8);
    if ((!bVar5) &&
       (pbVar8 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                 ::start_child(pbVar7),
       pbVar8 != (this->rightmost_).
                 super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<google::protobuf::Edition>,_google::protobuf::Edition>::checked_compare,_std::allocator<google::protobuf::Edition>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                 .
                 super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*,_2UL,_false>
                 .value)) {
      __assert_fail("parent->start_child()->is_internal() || parent->start_child() == rightmost()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                    ,0xa87,
                    "void absl::container_internal::btree<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>]"
                   );
    }
  }
  else {
    bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            ::position((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                        *)iter->node_);
    bVar4 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            ::start(pbVar7);
    if (bVar4 < bVar3) {
      fVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
              ::position((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                          *)iter->node_);
      this_00 = (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                 *)btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                   ::child(pbVar7,fVar1 + 0xff);
      fVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
              ::max_count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                           *)this_00);
      if (fVar1 != '=') {
        __assert_fail("left->max_count() == kNodeSlots",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                      ,0xa3c,
                      "void absl::container_internal::btree<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>]"
                     );
      }
      bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
              ::count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                       *)this_00);
      if (bVar3 < 0x3d) {
        bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                ::count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                         *)this_00);
        uVar10 = (uint)(byte)iter->position_;
        uVar9 = 0x3d - bVar3 >> (uVar10 < 0x3d);
        uVar9 = uVar9 + ((char)uVar9 == '\0');
        uVar6 = uVar9 & 0xff;
        bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                ::start((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                         *)iter->node_);
        if (((int)(uint)bVar3 <= (int)(uVar10 - uVar6)) ||
           (bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                    ::count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                             *)this_00), bVar3 + uVar6 < 0x3d)) {
          btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
          ::rebalance_right_to_left
                    ((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                      *)this_00,(field_type)uVar9,
                     (btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                      *)iter->node_,(allocator_type *)&this->rightmost_);
          bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                  ::max_count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                               *)iter->node_);
          bVar4 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                  ::count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                           *)iter->node_);
          if ((uint)bVar3 - (uint)bVar4 != uVar6) {
            __assert_fail("node->max_count() - node->count() == to_move",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                          ,0xa4b,
                          "void absl::container_internal::btree<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>]"
                         );
          }
          iVar11 = (byte)iter->position_ - uVar6;
          iter->position_ = iVar11;
          bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                  ::start((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                           *)iter->node_);
          if (iVar11 < (int)(uint)bVar3) {
            iVar11 = iter->position_;
            bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                    ::count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                             *)this_00);
            iter->position_ = (uint)bVar3 + iVar11 + 1;
            iter->node_ = this_00;
          }
          else {
            this_00 = iter->node_;
          }
          bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                  ::count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                           *)this_00);
          bVar4 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                  ::max_count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                               *)iter->node_);
          if (bVar3 < bVar4) {
            return;
          }
          __assert_fail("node->count() < node->max_count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                        ,0xa53,
                        "void absl::container_internal::btree<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>]"
                       );
        }
      }
    }
    bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            ::position((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                        *)iter->node_);
    bVar4 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            ::finish(pbVar7);
    if (bVar3 < bVar4) {
      fVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
              ::position((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                          *)iter->node_);
      pbVar8 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
               ::child(pbVar7,fVar1 + '\x01');
      fVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
              ::max_count(pbVar8);
      if (fVar1 != '=') {
        __assert_fail("right->max_count() == kNodeSlots",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                      ,0xa5c,
                      "void absl::container_internal::btree<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>]"
                     );
      }
      bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
              ::count(pbVar8);
      if (bVar3 < 0x3d) {
        bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                ::count(pbVar8);
        iVar11 = iter->position_;
        bVar4 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                ::start((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                         *)iter->node_);
        uVar9 = 0x3d - bVar3 >> ((int)(uint)bVar4 < iVar11);
        uVar9 = uVar9 + ((char)uVar9 == '\0');
        iVar11 = iter->position_;
        bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                ::finish((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                          *)iter->node_);
        uVar6 = uVar9 & 0xff;
        if (((int)(uint)(byte)iVar11 <= (int)(bVar3 - uVar6)) ||
           (bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                    ::count(pbVar8), bVar3 + uVar6 < 0x3d)) {
          btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
          ::rebalance_left_to_right
                    ((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                      *)iter->node_,(field_type)uVar9,pbVar8,(allocator_type *)&this->rightmost_);
          iVar11 = iter->position_;
          bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                  ::finish((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                            *)iter->node_);
          pbVar7 = (btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                    *)iter->node_;
          if ((int)(uint)bVar3 < iVar11) {
            iVar11 = iter->position_;
            bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                    ::count(pbVar7);
            iter->position_ = ~(uint)bVar3 + iVar11;
            iter->node_ = (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                           *)pbVar8;
            pbVar7 = pbVar8;
          }
          bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                  ::count(pbVar7);
          bVar4 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                  ::max_count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                               *)iter->node_);
          if (bVar3 < bVar4) {
            return;
          }
          __assert_fail("node->count() < node->max_count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                        ,0xa6f,
                        "void absl::container_internal::btree<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>]"
                       );
        }
      }
    }
    fVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            ::max_count(pbVar7);
    if (fVar1 != '=') {
      __assert_fail("parent->max_count() == kNodeSlots",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                    ,0xa77,
                    "void absl::container_internal::btree<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>]"
                   );
    }
    fVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            ::count(pbVar7);
    if (fVar1 == '=') {
      bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
              ::position((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                          *)iter->node_);
      parent_iter.position_ = (int)bVar3;
      parent_iter.node_ =
           (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
            *)pbVar7;
      rebalance_or_split(this,&parent_iter);
      pbVar7 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
               ::parent((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                         *)iter->node_);
    }
  }
  bVar5 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
          ::is_leaf((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                     *)iter->node_);
  fVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
          ::position((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                      *)iter->node_);
  alloc = &this->rightmost_;
  if (bVar5) {
    dest = new_leaf_node(this,fVar1 + '\x01',pbVar7);
    btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
    ::split((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
             *)iter->node_,iter->position_,dest,(allocator_type *)alloc);
    if ((btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
         *)(this->rightmost_).
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<google::protobuf::Edition>,_google::protobuf::Edition>::checked_compare,_std::allocator<google::protobuf::Edition>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
           .
           super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*,_2UL,_false>
           .value == iter->node_) {
      (alloc->
      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<google::protobuf::Edition>,_google::protobuf::Edition>::checked_compare,_std::allocator<google::protobuf::Edition>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
      ).
      super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_*,_2UL,_false>
      .value = dest;
    }
  }
  else {
    dest = new_internal_node(this,fVar1 + '\x01',pbVar7);
    btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
    ::split((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
             *)iter->node_,iter->position_,dest,(allocator_type *)alloc);
  }
  iVar11 = iter->position_;
  bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
          ::finish((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                    *)iter->node_);
  if ((int)(uint)bVar3 < iVar11) {
    iVar11 = iter->position_;
    bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            ::count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                     *)iter->node_);
    iter->position_ = ~(uint)bVar3 + iVar11;
    iter->node_ = (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                   *)dest;
  }
  return;
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
  node_type *&node = iter->node_;
  int &insert_position = iter->position_;
  assert(node->count() == node->max_count());
  assert(kNodeSlots == node->max_count());

  // First try to make room on the node by rebalancing.
  node_type *parent = node->parent();
  if (node != root()) {
    if (node->position() > parent->start()) {
      // Try rebalancing with our left sibling.
      node_type *left = parent->child(node->position() - 1);
      assert(left->max_count() == kNodeSlots);
      if (left->count() < kNodeSlots) {
        // We bias rebalancing based on the position being inserted. If we're
        // inserting at the end of the right node then we bias rebalancing to
        // fill up the left node.
        field_type to_move =
            (kNodeSlots - left->count()) /
            (1 + (static_cast<field_type>(insert_position) < kNodeSlots));
        to_move = (std::max)(field_type{1}, to_move);

        if (static_cast<field_type>(insert_position) - to_move >=
                node->start() ||
            left->count() + to_move < kNodeSlots) {
          left->rebalance_right_to_left(to_move, node, mutable_allocator());

          assert(node->max_count() - node->count() == to_move);
          insert_position = static_cast<int>(
              static_cast<field_type>(insert_position) - to_move);
          if (insert_position < node->start()) {
            insert_position = insert_position + left->count() + 1;
            node = left;
          }

          assert(node->count() < node->max_count());
          return;
        }
      }
    }

    if (node->position() < parent->finish()) {
      // Try rebalancing with our right sibling.
      node_type *right = parent->child(node->position() + 1);
      assert(right->max_count() == kNodeSlots);
      if (right->count() < kNodeSlots) {
        // We bias rebalancing based on the position being inserted. If we're
        // inserting at the beginning of the left node then we bias rebalancing
        // to fill up the right node.
        field_type to_move = (kNodeSlots - right->count()) /
                             (1 + (insert_position > node->start()));
        to_move = (std::max)(field_type{1}, to_move);

        if (static_cast<field_type>(insert_position) <=
                node->finish() - to_move ||
            right->count() + to_move < kNodeSlots) {
          node->rebalance_left_to_right(to_move, right, mutable_allocator());

          if (insert_position > node->finish()) {
            insert_position = insert_position - node->count() - 1;
            node = right;
          }

          assert(node->count() < node->max_count());
          return;
        }
      }
    }

    // Rebalancing failed, make sure there is room on the parent node for a new
    // value.
    assert(parent->max_count() == kNodeSlots);
    if (parent->count() == kNodeSlots) {
      iterator parent_iter(parent, node->position());
      rebalance_or_split(&parent_iter);
      parent = node->parent();
    }
  } else {
    // Rebalancing not possible because this is the root node.
    // Create a new root node and set the current root node as the child of the
    // new root.
    parent = new_internal_node(/*position=*/0, parent);
    parent->set_generation(root()->generation());
    parent->init_child(parent->start(), node);
    mutable_root() = parent;
    // If the former root was a leaf node, then it's now the rightmost node.
    assert(parent->start_child()->is_internal() ||
           parent->start_child() == rightmost());
  }

  // Split the node.
  node_type *split_node;
  if (node->is_leaf()) {
    split_node = new_leaf_node(node->position() + 1, parent);
    node->split(insert_position, split_node, mutable_allocator());
    if (rightmost() == node) mutable_rightmost() = split_node;
  } else {
    split_node = new_internal_node(node->position() + 1, parent);
    node->split(insert_position, split_node, mutable_allocator());
  }

  if (insert_position > node->finish()) {
    insert_position = insert_position - node->count() - 1;
    node = split_node;
  }
}